

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

size_t __thiscall cppurses::Text_display::last_index_at(Text_display *this,size_t line)

{
  pointer pLVar1;
  pointer pGVar2;
  pointer pGVar3;
  
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (line + 1 <
      (ulong)((long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4)) {
    return pLVar1[line + 1].start_index;
  }
  pGVar2 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar3 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar2 != pGVar3) {
    return ((long)pGVar3 - (long)pGVar2 >> 3) * -0x5555555555555555 - 1;
  }
  return 0;
}

Assistant:

std::size_t Text_display::last_index_at(std::size_t line) const {
    const auto next_line = line + 1;
    if (next_line >= display_state_.size()) {
        return this->end_index();
    }
    return display_state_.at(next_line).start_index;
}